

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

void reorder_invent(void)

{
  obj *poVar1;
  bool bVar2;
  obj *poVar3;
  boolean need_more_sorting;
  obj *next;
  obj *prev;
  obj *otmp;
  
  do {
    bVar2 = false;
    prev = invent;
    next = (obj *)0x0;
    while (prev != (obj *)0x0) {
      poVar1 = prev->nobj;
      if ((poVar1 == (obj *)0x0) || ((char)(prev->invlet ^ 0x20U) <= (char)(poVar1->invlet ^ 0x20U))
         ) {
        next = prev;
        prev = poVar1;
      }
      else {
        bVar2 = true;
        poVar3 = poVar1;
        if (next != (obj *)0x0) {
          next->nobj = poVar1;
          poVar3 = invent;
        }
        invent = poVar3;
        prev->nobj = poVar1->nobj;
        poVar1->nobj = prev;
        next = poVar1;
      }
    }
  } while (bVar2);
  return;
}

Assistant:

static void reorder_invent(void)
{
	struct obj *otmp, *prev, *next;
	boolean need_more_sorting;

	do {
	    /*
	     * We expect at most one item to be out of order, so this
	     * isn't nearly as inefficient as it may first appear.
	     */
	    need_more_sorting = FALSE;
	    for (otmp = invent, prev = 0; otmp; ) {
		next = otmp->nobj;
		if (next && inv_rank(next) < inv_rank(otmp)) {
		    need_more_sorting = TRUE;
		    if (prev) prev->nobj = next;
		    else      invent = next;
		    otmp->nobj = next->nobj;
		    next->nobj = otmp;
		    prev = next;
		} else {
		    prev = otmp;
		    otmp = next;
		}
	    }
	} while (need_more_sorting);
}